

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O1

int Abc_NtkMakeLegit(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  char *in_RSI;
  Abc_Ntk_t *pNode;
  long lVar4;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanOrder.c"
                  ,0x1d1,"int Abc_NtkMakeLegit(Abc_Ntk_t *)");
  }
  pVVar2 = pNtk->vObjs;
  if (pVVar2->nSize < 1) {
    uVar3 = 0;
    pNode = pNtk;
  }
  else {
    lVar4 = 0;
    uVar3 = 0;
    do {
      pNode = (Abc_Ntk_t *)pVVar2->pArray[lVar4];
      if ((pNode != (Abc_Ntk_t *)0x0) && (((ulong)pNode->pSpec & 0xf00000000) == 0x700000000)) {
        iVar1 = Abc_NodeMakeLegit((Abc_Obj_t *)pNode);
        uVar3 = uVar3 + iVar1;
      }
      lVar4 = lVar4 + 1;
      pVVar2 = pNtk->vObjs;
    } while (lVar4 < pVVar2->nSize);
  }
  if (uVar3 != 0) {
    Abc_Print((int)pNode,in_RSI,(ulong)uVar3);
  }
  return 1;
}

Assistant:

int Abc_NtkMakeLegit( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, Counter = 0;
    assert( Abc_NtkHasSop(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
        Counter += Abc_NodeMakeLegit( pNode );
    if ( Counter )
        Abc_Print( 0, "%d nodes were made dist1-cube-free and/or single-cube-containment-free.\n", Counter );
    return 1;
}